

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O2

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::scrollContentsBy
          (AbstractScrollAreaPrivate *this,int dx,int dy)

{
  int *piVar1;
  ScrollIndicator *pSVar2;
  int iVar3;
  
  (this->topLeftCorner).xp = (this->topLeftCorner).xp - dx;
  piVar1 = &(this->topLeftCorner).yp;
  *piVar1 = *piVar1 - dy;
  if (dx != 0) {
    this->horIndicator->needPaint = true;
    iVar3 = QColor::alpha();
    pSVar2 = this->horIndicator;
    pSVar2->alpha = iVar3;
    pSVar2->animate = false;
    iVar3 = QColor::alpha();
    pSVar2 = this->vertIndicator;
    pSVar2->alpha = iVar3;
    pSVar2->animate = false;
    QTimer::stop();
    QWidget::raise();
  }
  if (dy != 0) {
    this->vertIndicator->needPaint = true;
    iVar3 = QColor::alpha();
    pSVar2 = this->vertIndicator;
    pSVar2->alpha = iVar3;
    pSVar2->animate = false;
    iVar3 = QColor::alpha();
    pSVar2 = this->horIndicator;
    pSVar2->alpha = iVar3;
    pSVar2->animate = false;
    QTimer::stop();
    QWidget::raise();
  }
  makeBlurEffectIfNeeded(this);
  calcIndicators(this);
  QWidget::update();
  QWidget::update();
  QWidget::update();
  return;
}

Assistant:

void
AbstractScrollAreaPrivate::scrollContentsBy( int dx, int dy )
{
	topLeftCorner -= QPoint( dx, dy );

	if( dx != 0 )
	{
		horIndicator->needPaint = true;
		horIndicator->alpha = horIndicator->color.alpha();
		horIndicator->animate = false;
		vertIndicator->alpha = vertIndicator->color.alpha();
		vertIndicator->animate = false;
		animationTimer->stop();
		horIndicator->raise();
	}

	if( dy != 0 )
	{
		vertIndicator->needPaint = true;
		vertIndicator->alpha = vertIndicator->color.alpha();
		vertIndicator->animate = false;
		horIndicator->alpha = horIndicator->color.alpha();
		horIndicator->animate = false;
		animationTimer->stop();
		vertIndicator->raise();
	}

	makeBlurEffectIfNeeded();

	calcIndicators();

	q->update();
	horIndicator->update();
	vertIndicator->update();
}